

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O2

void Handlers::Talk_Open(Character *character,PacketReader *reader)

{
  World *pWVar1;
  Party *this;
  int iVar2;
  time_t tVar3;
  mapped_type *this_00;
  string message;
  allocator<char> local_79;
  string local_78;
  string local_58;
  key_type local_38;
  
  if (character->party != (Party *)0x0) {
    iVar2 = character->muted_until;
    tVar3 = time((time_t *)0x0);
    if (iVar2 <= tVar3) {
      PacketReader::GetEndString_abi_cxx11_(&local_78,reader);
      pWVar1 = character->world;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ChatLength",&local_79)
      ;
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar1->config,&local_38);
      iVar2 = util::variant::GetInt(this_00);
      limit_message(&local_78,(long)iVar2);
      std::__cxx11::string::~string((string *)&local_38);
      this = character->party;
      std::__cxx11::string::string((string *)&local_58,(string *)&local_78);
      Party::Msg(this,character,&local_58,false);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  return;
}

Assistant:

void Talk_Open(Character *character, PacketReader &reader)
{
	if (!character->party) return;
	if (character->muted_until > time(0)) return;

	std::string message = reader.GetEndString(); // message
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));

	character->party->Msg(character, message, false);
}